

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfilt.c
# Opt level: O3

void lograw(uchar *buffer,ssize_t len)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  char *format;
  long lVar6;
  int iVar7;
  long lVar8;
  char *buffer_00;
  char data [120];
  char local_a8 [120];
  
  if (len < 1) {
    return;
  }
  buffer_00 = local_a8;
  iVar7 = 0x78;
  lVar6 = 0;
  lVar8 = 0;
  do {
    bVar1 = buffer[lVar8];
    if (bVar1 == 0xd) {
      format = "\\r";
LAB_00106204:
      curl_msnprintf(buffer_00,(long)iVar7,format);
      iVar2 = -2;
      lVar4 = 2;
    }
    else {
      if (bVar1 == 10) {
        format = "\\n";
        goto LAB_00106204;
      }
      iVar2 = Curl_isgraph((uint)bVar1);
      uVar3 = 0x2e;
      if (buffer[lVar8] == 0x20) {
        uVar3 = 0x20;
      }
      uVar5 = (ulong)uVar3;
      if (iVar2 != 0) {
        uVar5 = (ulong)buffer[lVar8];
      }
      curl_msnprintf(buffer_00,(long)iVar7,"%c",uVar5);
      iVar2 = -1;
      lVar4 = 1;
    }
    lVar6 = lVar6 + lVar4;
    if (lVar6 < 0x3d) {
      iVar7 = iVar7 + iVar2;
      buffer_00 = buffer_00 + lVar4;
      lVar8 = lVar8 + 1;
      if (lVar8 == len) {
        if (lVar6 != 0) {
          logmsg("\'%s\'",local_a8);
          return;
        }
        return;
      }
    }
    else {
      buffer_00 = local_a8;
      logmsg("\'%s\'",buffer_00);
      lVar8 = lVar8 + 1;
      iVar7 = 0x78;
      lVar6 = 0;
      if (lVar8 == len) {
        return;
      }
    }
  } while( true );
}

Assistant:

static void lograw(unsigned char *buffer, ssize_t len)
{
  char data[120];
  ssize_t i;
  unsigned char *ptr = buffer;
  char *optr = data;
  ssize_t width = 0;
  int left = sizeof(data);

  for(i = 0; i<len; i++) {
    switch(ptr[i]) {
    case '\n':
      snprintf(optr, left, "\\n");
      width += 2;
      optr += 2;
      left -= 2;
      break;
    case '\r':
      snprintf(optr, left, "\\r");
      width += 2;
      optr += 2;
      left -= 2;
      break;
    default:
      snprintf(optr, left, "%c", (ISGRAPH(ptr[i]) ||
                                  ptr[i] == 0x20) ?ptr[i]:'.');
      width++;
      optr++;
      left--;
      break;
    }

    if(width>60) {
      logmsg("'%s'", data);
      width = 0;
      optr = data;
      left = sizeof(data);
    }
  }
  if(width)
    logmsg("'%s'", data);
}